

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntTwoFindCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  Vec_Int_t *vArr_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  pBeg2 = vArr1->pArray;
  pEnd1 = vArr2->pArray;
  piVar2 = vArr1->pArray;
  iVar4 = vArr1->nSize;
  piVar3 = vArr2->pArray;
  iVar1 = vArr2->nSize;
  Vec_IntClear(vArr);
  while (pBeg2 < piVar2 + iVar4 && pEnd1 < piVar3 + iVar1) {
    if (*pBeg2 == *pEnd1) {
      Vec_IntPush(vArr,*pBeg2);
      pBeg2 = pBeg2 + 1;
      pEnd1 = pEnd1 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      pBeg2 = pBeg2 + 1;
    }
    else {
      pEnd1 = pEnd1 + 1;
    }
  }
  iVar4 = Vec_IntSize(vArr);
  return iVar4;
}

Assistant:

static inline int Vec_IntTwoFindCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    Vec_IntClear( vArr );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1 ), pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            pBeg1++;
        else 
            pBeg2++;
    }
    return Vec_IntSize(vArr);
}